

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined1 auVar27 [24];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  long lVar33;
  long lVar34;
  int64_t iVar35;
  long lVar36;
  long lVar37;
  int64_t iVar38;
  long lVar39;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long in_stack_00000008;
  int32_t k;
  int64_t *j_1;
  int64_t *i_1;
  int64_t *t;
  __m256i cond_Jlt;
  __m256i cond_all;
  __m256i cond_max;
  __m256i cond_eq;
  __m256i cond_valid_IJ;
  __m256i cond_valid_J;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIltLimit;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vJLimit;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vMaxH;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vN;
  __m256i vOne;
  __m256i vZero;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf0;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *F_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_F_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int local_1324;
  long local_1320;
  int local_1304;
  long local_1300;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  long lVar75;
  undefined4 in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  int local_12a0;
  int local_129c;
  long *local_1298;
  long *local_1290;
  ulong *local_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1120 [32];
  undefined1 local_1100 [24];
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [24];
  long lStack_10a8;
  undefined1 local_10a0 [32];
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [32];
  long local_fa0;
  long lStack_f98;
  long lStack_f90;
  long lStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [32];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  ulong local_e08;
  ulong local_e00;
  ulong local_df8;
  int local_df0;
  int local_dec;
  int local_de8;
  int local_de4;
  parasail_result_t *local_de0;
  int64_t *local_dd8;
  int64_t *local_dd0;
  int64_t *local_dc8;
  int64_t *local_dc0;
  int64_t *local_db8;
  int64_t *local_db0;
  int64_t *local_da8;
  int local_d9c;
  int local_d98;
  int local_d94;
  int local_d90;
  int local_d8c;
  int local_d88;
  int local_d7c;
  long local_d78;
  long local_d68;
  parasail_result_t *local_d60;
  ulong local_d58;
  ulong local_d50;
  undefined8 local_d48;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  ulong local_d28;
  ulong local_d20;
  ulong local_d18;
  ulong local_d10;
  ulong local_d08;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  ulong local_be0;
  ulong local_bd8;
  ulong local_bd0;
  ulong local_bc8;
  undefined1 local_bc0 [16];
  undefined1 auStack_bb0 [16];
  ulong local_ba0;
  ulong local_b98;
  ulong local_b90;
  ulong local_b88;
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  ulong local_b60;
  ulong local_b58;
  ulong local_b50;
  ulong local_b48;
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  ulong local_b20;
  ulong local_b18;
  ulong local_b10;
  ulong local_b08;
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  ulong local_ae0;
  ulong local_ad8;
  ulong local_ad0;
  ulong local_ac8;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  undefined8 local_a60;
  undefined8 local_a58;
  undefined8 local_a50;
  undefined8 local_a48;
  undefined1 local_a40 [16];
  undefined1 auStack_a30 [16];
  undefined8 local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined8 local_a08;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined8 local_9e0;
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 local_9c8;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  ulong local_9a0;
  ulong local_998;
  ulong local_990;
  ulong local_988;
  undefined1 local_980 [32];
  ulong local_960;
  ulong local_958;
  ulong local_950;
  ulong local_948;
  undefined1 local_940 [16];
  undefined1 auStack_930 [16];
  ulong local_920;
  ulong local_918;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  long local_800;
  long lStack_7f8;
  long lStack_7f0;
  long lStack_7e8;
  long local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  ulong local_7c0;
  long lStack_7b8;
  long lStack_7b0;
  long lStack_7a8;
  ulong local_7a0;
  long lStack_798;
  long lStack_790;
  long lStack_788;
  long local_780;
  long lStack_778;
  long lStack_770;
  long lStack_768;
  undefined1 local_760 [16];
  undefined8 uStack_750;
  undefined8 uStack_748;
  long local_740;
  long lStack_738;
  long lStack_730;
  long lStack_728;
  long local_720;
  long lStack_718;
  long lStack_710;
  long lStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  int64_t iStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  int64_t iStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  long local_560;
  long lStack_558;
  long lStack_550;
  long lStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  ulong local_500;
  long lStack_4f8;
  long lStack_4f0;
  long lStack_4e8;
  ulong local_4e0;
  long lStack_4d8;
  long lStack_4d0;
  long lStack_4c8;
  long local_4c0;
  long lStack_4b8;
  long lStack_4b0;
  long lStack_4a8;
  long local_4a0;
  long lStack_498;
  long lStack_490;
  long lStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  long local_420;
  long lStack_418;
  long lStack_410;
  long lStack_408;
  long local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  long local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  long local_360;
  long lStack_358;
  long lStack_350;
  long lStack_348;
  long local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  ulong local_2a0;
  long lStack_298;
  long lStack_290;
  long lStack_288;
  ulong local_280;
  long lStack_278;
  long lStack_270;
  long lStack_268;
  long local_260;
  long lStack_258;
  long lStack_250;
  long lStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  long local_160;
  long lStack_158;
  long lStack_150;
  long lStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_d88 = 0;
  local_d8c = 0;
  local_d90 = 0;
  local_d94 = 0;
  local_d98 = 0;
  local_d9c = 0;
  local_da8 = (int64_t *)0x0;
  local_db0 = (int64_t *)0x0;
  local_db8 = (int64_t *)0x0;
  local_dc0 = (int64_t *)0x0;
  local_dc8 = (int64_t *)0x0;
  local_dd0 = (int64_t *)0x0;
  local_dd8 = (int64_t *)0x0;
  local_de0 = (parasail_result_t *)0x0;
  local_de4 = 0;
  local_de8 = 0;
  local_dec = 0;
  local_df0 = 0;
  local_df8 = 0;
  local_e00 = 0;
  local_e08 = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_avx2_256_64","_s2");
    local_d60 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_avx2_256_64","s2Len");
    local_d60 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_avx2_256_64","open");
    local_d60 = (parasail_result_t *)0x0;
  }
  else if (in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_diag_avx2_256_64","gap");
    local_d60 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_avx2_256_64","matrix");
    local_d60 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_diag_avx2_256_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_diag_avx2_256_64","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_d88 = 4;
    local_d8c = 3;
    local_d90 = 6;
    local_12a0 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_12a0 = *(int *)(in_stack_00000008 + 0x34);
    }
    local_d94 = local_12a0;
    local_d98 = local_12a0 + 3;
    local_d9c = in_ECX + 3;
    local_de4 = 0;
    local_de8 = 0;
    local_dec = 0;
    local_df0 = 0;
    if (-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      lVar33 = (long)in_R8D;
    }
    else {
      lVar33 = -(long)*(int *)(in_stack_00000008 + 0x20);
    }
    local_e08 = lVar33 + 0x8000000000000001;
    local_e00 = 0x7ffffffffffffffe - (long)*(int *)(in_stack_00000008 + 0x1c);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_e08;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_e08;
    local_c00 = vpunpcklqdq_avx(auVar40,auVar52);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_e08;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_e08;
    auStack_bf0 = vpunpcklqdq_avx(auVar53,auVar67);
    local_e40 = local_c00._0_8_;
    uStack_e38 = local_c00._8_8_;
    uStack_e30 = auStack_bf0._0_8_;
    uStack_e28 = auStack_bf0._8_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_e00;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_e00;
    local_bc0 = vpunpcklqdq_avx(auVar41,auVar54);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_e00;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_e00;
    auStack_bb0 = vpunpcklqdq_avx(auVar55,auVar68);
    local_e60 = local_bc0._0_8_;
    uStack_e58 = local_bc0._8_8_;
    uStack_e50 = auStack_bb0._0_8_;
    uStack_e48 = auStack_bb0._8_8_;
    local_e80 = local_bc0._0_8_;
    uStack_e78 = local_bc0._8_8_;
    uStack_e70 = auStack_bb0._0_8_;
    uStack_e68 = auStack_bb0._8_8_;
    local_ea0 = local_c00._0_8_;
    uStack_e98 = local_c00._8_8_;
    uStack_e90 = auStack_bf0._0_8_;
    uStack_e88 = auStack_bf0._8_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_e08;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_e08;
    local_b80 = vpunpcklqdq_avx(auVar42,auVar56);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_e08;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_e08;
    auStack_b70 = vpunpcklqdq_avx(auVar57,auVar69);
    local_ec0 = local_b80._0_8_;
    uStack_eb8 = local_b80._8_8_;
    uStack_eb0 = auStack_b70._0_8_;
    uStack_ea8 = auStack_b70._8_8_;
    auVar7._16_8_ = auStack_b70._0_8_;
    auVar7._0_16_ = local_b80;
    auVar7._24_8_ = auStack_b70._8_8_;
    local_c20 = vpslldq_avx2(ZEXT1632(auStack_b70),8);
    local_c40 = vpsrldq_avx2(auVar7,8);
    local_ee0 = vpor_avx2(local_c20,local_c40);
    local_d20 = (ulong)in_R8D;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_d20;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_d20;
    local_b40 = vpunpcklqdq_avx(auVar43,auVar58);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_d20;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_d20;
    auStack_b30 = vpunpcklqdq_avx(auVar59,auVar70);
    local_f00 = local_b40._0_8_;
    uStack_ef8 = local_b40._8_8_;
    uStack_ef0 = auStack_b30._0_8_;
    uStack_ee8 = auStack_b30._8_8_;
    local_d28 = (ulong)in_R9D;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_d28;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_d28;
    local_b00 = vpunpcklqdq_avx(auVar44,auVar60);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_d28;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_d28;
    auStack_af0 = vpunpcklqdq_avx(auVar61,auVar71);
    local_f20 = local_b00._0_8_;
    uStack_f18 = local_b00._8_8_;
    uStack_f10 = auStack_af0._0_8_;
    uStack_f08 = auStack_af0._8_8_;
    local_d30 = 0;
    local_a88 = 0;
    local_a90 = 0;
    local_a98 = 0;
    local_aa0 = 0;
    local_ac0 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    auStack_ab0 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    local_f40 = local_ac0._0_8_;
    uStack_f38 = local_ac0._8_8_;
    uStack_f30 = auStack_ab0._0_8_;
    uStack_f28 = auStack_ab0._8_8_;
    local_d38 = 1;
    local_a48 = 1;
    local_a50 = 1;
    local_a58 = 1;
    local_a60 = 1;
    local_a80 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_a70 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_f60 = local_a80._0_8_;
    uStack_f58 = local_a80._8_8_;
    uStack_f50 = auStack_a70._0_8_;
    uStack_f48 = auStack_a70._8_8_;
    local_d40 = 4;
    local_a40 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    auStack_a30 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    local_f80 = local_a40._0_8_;
    uStack_f78 = local_a40._8_8_;
    uStack_f70 = auStack_a30._0_8_;
    uStack_f68 = auStack_a30._8_8_;
    local_d48 = 0xffffffffffffffff;
    local_9c8 = 0xffffffffffffffff;
    local_9d0 = 0xffffffffffffffff;
    local_9d8 = 0xffffffffffffffff;
    local_9e0 = 0xffffffffffffffff;
    local_a00 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auStack_9f0 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    local_fa0 = local_a00._0_8_;
    lStack_f98 = local_a00._8_8_;
    lStack_f90 = auStack_9f0._0_8_;
    lStack_f88 = auStack_9f0._8_8_;
    local_888 = 0;
    local_890 = 1;
    local_898 = 2;
    local_8a0 = 3;
    local_8c0 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_8b0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_fc0._16_8_ = auStack_8b0._0_8_;
    local_fc0._0_16_ = local_8c0;
    local_fc0._24_8_ = auStack_8b0._8_8_;
    local_8c8 = 0;
    local_8d0 = 0xffffffffffffffff;
    local_8d8 = 0xfffffffffffffffe;
    local_8e0 = 0xfffffffffffffffd;
    local_900 = vpunpcklqdq_avx(ZEXT816(0xfffffffffffffffd),ZEXT816(0xfffffffffffffffe));
    auStack_8f0 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0));
    local_fe0 = local_900._0_8_;
    uStack_fd8 = local_900._8_8_;
    uStack_fd0 = auStack_8f0._0_8_;
    uStack_fc8 = auStack_8f0._8_8_;
    local_1000._16_8_ = auStack_b70._0_8_;
    local_1000._0_16_ = local_b80;
    local_1000._24_8_ = auStack_b70._8_8_;
    local_1020._16_8_ = auStack_b70._0_8_;
    local_1020._0_16_ = local_b80;
    local_1020._24_8_ = auStack_b70._8_8_;
    local_1040._16_8_ = auStack_b70._0_8_;
    local_1040._0_16_ = local_b80;
    local_1040._24_8_ = auStack_b70._8_8_;
    local_d50 = (ulong)local_12a0;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_d50;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_d50;
    auVar40 = vpunpcklqdq_avx(auVar45,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_d50;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_d50;
    auStack_9b0 = vpunpcklqdq_avx(auVar63,auVar72);
    local_9c0._0_8_ = auVar40._0_8_;
    uVar29 = local_9c0._0_8_;
    local_9c0._8_8_ = auVar40._8_8_;
    uVar30 = local_9c0._8_8_;
    uVar31 = auStack_9b0._0_8_;
    uVar32 = auStack_9b0._8_8_;
    local_d58 = (ulong)in_ECX;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_d58;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_d58;
    auVar41 = vpunpcklqdq_avx(auVar46,auVar64);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_d58;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_d58;
    auVar42 = vpunpcklqdq_avx(auVar47,auVar73);
    auVar49._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar42;
    auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
    local_df8 = local_e08;
    local_d7c = in_ECX;
    local_d78 = in_RDX;
    local_d68 = in_RDI;
    local_d18 = local_e08;
    local_d10 = local_e00;
    local_d08 = local_e08;
    local_be0 = local_e08;
    local_bd8 = local_e08;
    local_bd0 = local_e08;
    local_bc8 = local_e08;
    local_ba0 = local_e00;
    local_b98 = local_e00;
    local_b90 = local_e00;
    local_b88 = local_e00;
    local_b60 = local_e08;
    local_b58 = local_e08;
    local_b50 = local_e08;
    local_b48 = local_e08;
    local_b20 = local_d20;
    local_b18 = local_d20;
    local_b10 = local_d20;
    local_b08 = local_d20;
    local_ae0 = local_d28;
    local_ad8 = local_d28;
    local_ad0 = local_d28;
    local_ac8 = local_d28;
    local_a20 = local_d40;
    local_a18 = local_d40;
    local_a10 = local_d40;
    local_a08 = local_d40;
    local_9c0 = auVar40;
    local_9a0 = local_d50;
    local_998 = local_d50;
    local_990 = local_d50;
    local_988 = local_d50;
    local_980 = auVar49;
    local_960 = local_d58;
    local_958 = local_d58;
    local_950 = local_d58;
    local_948 = local_d58;
    local_de0 = parasail_result_new();
    if (local_de0 == (parasail_result_t *)0x0) {
      local_d60 = (parasail_result_t *)0x0;
    }
    else {
      local_de0->flag = local_de0->flag | 0x4801004;
      local_db0 = parasail_memalign_int64_t(0x20,(long)(local_d7c + local_d90));
      local_db8 = parasail_memalign_int64_t(0x20,(long)(local_d7c + local_d90));
      local_dc0 = parasail_memalign_int64_t(0x20,(long)(local_d7c + local_d90));
      local_dc8 = local_db0 + local_d8c;
      local_dd0 = local_db8 + local_d8c;
      local_dd8 = local_dc0 + local_d8c;
      if (local_db0 == (int64_t *)0x0) {
        local_d60 = (parasail_result_t *)0x0;
      }
      else if (local_db8 == (int64_t *)0x0) {
        local_d60 = (parasail_result_t *)0x0;
      }
      else if (local_dc0 == (int64_t *)0x0) {
        local_d60 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_da8 = parasail_memalign_int64_t(0x20,(long)(local_d94 + local_d8c));
          if (local_da8 == (int64_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_de4 = 0; local_de4 < local_d94; local_de4 = local_de4 + 1) {
            local_da8[local_de4] =
                 (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                               (ulong)*(byte *)(local_d68 + local_de4) * 4);
          }
          for (local_de4 = local_d94; local_de4 < local_d98; local_de4 = local_de4 + 1) {
            local_da8[local_de4] = 0;
          }
        }
        for (local_de8 = 0; local_de8 < local_d7c; local_de8 = local_de8 + 1) {
          local_dc8[local_de8] =
               (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                             (ulong)*(byte *)(local_d78 + local_de8) * 4);
        }
        for (local_de8 = -local_d8c; local_de8 < 0; local_de8 = local_de8 + 1) {
          local_dc8[local_de8] = 0;
        }
        for (local_de8 = local_d7c; local_de8 < local_d9c; local_de8 = local_de8 + 1) {
          local_dc8[local_de8] = 0;
        }
        for (local_de8 = 0; local_de8 < local_d7c; local_de8 = local_de8 + 1) {
          local_dd0[local_de8] = 0;
          local_dd8[local_de8] = local_df8;
        }
        for (local_de8 = -local_d8c; local_de8 < 0; local_de8 = local_de8 + 1) {
          local_dd0[local_de8] = local_df8;
          local_dd8[local_de8] = local_df8;
        }
        for (local_de8 = local_d7c; local_de8 < local_d7c + local_d8c; local_de8 = local_de8 + 1) {
          local_dd0[local_de8] = local_df8;
          local_dd8[local_de8] = local_df8;
        }
        for (local_de4 = 0; local_de4 < local_d94; local_de4 = local_d88 + local_de4) {
          local_10a0 = local_ee0;
          _local_10c0 = local_ee0;
          local_10e0._8_8_ = uStack_eb8;
          local_10e0._0_8_ = local_ec0;
          local_10e0._16_8_ = uStack_eb0;
          local_10e0._24_8_ = uStack_ea8;
          local_1100._8_8_ = uStack_eb8;
          local_1100._0_8_ = local_ec0;
          local_1100._16_8_ = uStack_eb0;
          uStack_10e8 = uStack_ea8;
          local_1120._8_8_ = uStack_fd8;
          local_1120._0_8_ = local_fe0;
          local_1120._16_8_ = uStack_fd0;
          local_1120._24_8_ = uStack_fc8;
          lVar33 = *(long *)(in_stack_00000008 + 8);
          lVar34 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar35 = local_da8[local_de4];
          }
          else {
            in_stack_ffffffffffffed3c = local_de4;
            if (local_d94 <= local_de4) {
              in_stack_ffffffffffffed3c = local_d94 + -1;
            }
            iVar35 = (int64_t)in_stack_ffffffffffffed3c;
          }
          lVar36 = lVar33 + lVar34 * iVar35 * 4;
          lVar75 = *(long *)(in_stack_00000008 + 8);
          lVar37 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar38 = local_da8[local_de4 + 1];
          }
          else {
            if (local_de4 + 1 < local_d94) {
              in_stack_ffffffffffffed1c = local_de4 + 1;
            }
            else {
              in_stack_ffffffffffffed1c = local_d94 + -1;
            }
            iVar38 = (int64_t)in_stack_ffffffffffffed1c;
          }
          lVar39 = lVar75 + lVar37 * iVar38 * 4;
          lVar3 = *(long *)(in_stack_00000008 + 8);
          iVar1 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1300 = local_da8[local_de4 + 2];
          }
          else {
            if (local_de4 + 2 < local_d94) {
              local_1304 = local_de4 + 2;
            }
            else {
              local_1304 = local_d94 + -1;
            }
            local_1300 = (long)local_1304;
          }
          lVar4 = *(long *)(in_stack_00000008 + 8);
          iVar2 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1320 = local_da8[local_de4 + 3];
          }
          else {
            if (local_de4 + 3 < local_d94) {
              local_1324 = local_de4 + 3;
            }
            else {
              local_1324 = local_d94 + -1;
            }
            local_1320 = (long)local_1324;
          }
          local_6e0 = uVar29;
          uStack_6d8 = uVar30;
          uStack_6d0 = uVar31;
          uStack_6c8 = uVar32;
          local_700 = local_fc0._0_8_;
          uStack_6f8 = local_fc0._8_8_;
          uStack_6f0 = local_fc0._16_8_;
          uStack_6e8 = local_fc0._24_8_;
          auVar5._16_8_ = uVar31;
          auVar5._0_16_ = auVar40;
          auVar5._24_8_ = uVar32;
          auVar7 = vpcmpgtq_avx2(auVar5,local_fc0);
          local_de8 = 0;
          while( true ) {
            auVar5 = local_10a0;
            uStack_1068 = auVar49._24_8_;
            uStack_1070 = auVar49._16_8_;
            if (local_d7c + local_d8c <= local_de8) break;
            uVar26 = local_10a0._0_8_;
            uVar28 = local_10a0._24_8_;
            local_c60 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffef50),8);
            local_c80 = vpsrldq_avx2(_local_10c0,8);
            auVar50 = vpor_avx2(local_c60,local_c80);
            iStack_5c8 = local_dd0[local_de8];
            local_10a0._0_24_ = auVar50._0_24_;
            auVar27 = local_10a0._0_24_;
            local_10a0._24_8_ = iStack_5c8;
            auVar9 = local_10a0;
            local_ca0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffef10),8);
            local_cc0 = vpsrldq_avx2(_local_1100,8);
            auVar51 = vpor_avx2(local_ca0,local_cc0);
            iStack_608 = local_dd8[local_de8];
            local_10a0._0_8_ = auVar50._0_8_;
            local_10a0._8_8_ = auVar50._8_8_;
            local_10a0._16_8_ = auVar50._16_8_;
            local_5e0 = local_10a0._0_8_;
            uStack_5d8 = local_10a0._8_8_;
            uStack_5d0 = local_10a0._16_8_;
            local_600 = local_f00;
            uStack_5f8 = uStack_ef8;
            uStack_5f0 = uStack_ef0;
            uStack_5e8 = uStack_ee8;
            auVar17._24_8_ = iStack_5c8;
            auVar17._0_24_ = auVar27;
            auVar16._8_8_ = uStack_ef8;
            auVar16._0_8_ = local_f00;
            auVar16._16_8_ = uStack_ef0;
            auVar16._24_8_ = uStack_ee8;
            auVar50 = vpsubq_avx2(auVar17,auVar16);
            local_1100._0_8_ = auVar51._0_8_;
            local_1100._8_8_ = auVar51._8_8_;
            local_1100._16_8_ = auVar51._16_8_;
            local_620 = local_1100._0_8_;
            uStack_618 = local_1100._8_8_;
            uStack_610 = local_1100._16_8_;
            local_640 = local_f20;
            uStack_638 = uStack_f18;
            uStack_630 = uStack_f10;
            uStack_628 = uStack_f08;
            auVar15._24_8_ = iStack_608;
            auVar15._0_24_ = auVar51._0_24_;
            auVar8._8_8_ = uStack_f18;
            auVar8._0_8_ = local_f20;
            auVar8._16_8_ = uStack_f10;
            auVar8._24_8_ = uStack_f08;
            vpsubq_avx2(auVar15,auVar8);
            a[0]._4_4_ = in_stack_ffffffffffffed3c;
            a[0]._0_4_ = in_stack_ffffffffffffed38;
            a[1] = iVar35;
            a[2] = lVar33;
            a[3] = lVar34;
            b[0]._4_4_ = in_stack_ffffffffffffed1c;
            b[0]._0_4_ = in_stack_ffffffffffffed18;
            b[1] = iVar38;
            b[2] = lVar75;
            b[3] = lVar37;
            _mm256_max_epi64_rpl(a,b);
            local_660 = local_10c0._0_8_;
            uStack_658 = local_10c0._8_8_;
            uStack_650 = local_10c0._16_8_;
            uStack_648 = lStack_10a8;
            local_680 = local_f00;
            uStack_678 = uStack_ef8;
            uStack_670 = uStack_ef0;
            uStack_668 = uStack_ee8;
            auVar51._8_8_ = uStack_ef8;
            auVar51._0_8_ = local_f00;
            auVar51._16_8_ = uStack_ef0;
            auVar51._24_8_ = uStack_ee8;
            auVar51 = vpsubq_avx2(_local_10c0,auVar51);
            local_6a0 = local_10e0._0_8_;
            uStack_698 = local_10e0._8_8_;
            uStack_690 = local_10e0._16_8_;
            uStack_688 = local_10e0._24_8_;
            local_6c0 = local_f20;
            uStack_6b8 = uStack_f18;
            uStack_6b0 = uStack_f10;
            uStack_6a8 = uStack_f08;
            auVar6._8_8_ = uStack_f18;
            auVar6._0_8_ = local_f20;
            auVar6._16_8_ = uStack_f10;
            auVar6._24_8_ = uStack_f08;
            vpsubq_avx2(local_10e0,auVar6);
            a_00[0]._4_4_ = in_stack_ffffffffffffed3c;
            a_00[0]._0_4_ = in_stack_ffffffffffffed38;
            a_00[1] = iVar35;
            a_00[2] = lVar33;
            a_00[3] = lVar34;
            b_00[0]._4_4_ = in_stack_ffffffffffffed1c;
            b_00[0]._0_4_ = in_stack_ffffffffffffed18;
            b_00[1] = iVar38;
            b_00[2] = lVar75;
            b_00[3] = lVar37;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_908 = (ulong)*(int *)(lVar36 + local_dc8[local_de8] * 4);
            local_910 = (ulong)*(int *)(lVar39 + local_dc8[local_de8 + -1] * 4);
            local_918 = (ulong)*(int *)(lVar3 + iVar1 * local_1300 * 4 +
                                       local_dc8[local_de8 + -2] * 4);
            local_920 = (ulong)*(int *)(lVar4 + iVar2 * local_1320 * 4 +
                                       local_dc8[local_de8 + -3] * 4);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = local_920;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = local_918;
            local_940 = vpunpcklqdq_avx(auVar48,auVar65);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = local_910;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = local_908;
            auStack_930 = vpunpcklqdq_avx(auVar66,auVar74);
            uStack_1198 = auVar5._8_8_;
            uStack_1190 = auVar5._16_8_;
            local_520 = uVar26;
            uStack_518 = uStack_1198;
            uStack_510 = uStack_1190;
            uStack_508 = uVar28;
            local_540 = local_940._0_8_;
            uStack_538 = local_940._8_8_;
            uStack_530 = auStack_930._0_8_;
            uStack_528 = auStack_930._8_8_;
            auVar19._16_8_ = auStack_930._0_8_;
            auVar19._0_16_ = local_940;
            auVar19._24_8_ = auStack_930._8_8_;
            auVar5 = vpaddq_avx2(auVar5,auVar19);
            local_11a0 = auVar5._0_8_;
            uStack_1198 = auVar5._8_8_;
            uStack_1190 = auVar5._16_8_;
            uStack_1188 = auVar5._24_8_;
            a_01[0]._4_4_ = in_stack_ffffffffffffed3c;
            a_01[0]._0_4_ = in_stack_ffffffffffffed38;
            a_01[1] = iVar35;
            a_01[2] = lVar33;
            a_01[3] = lVar34;
            b_01[0]._4_4_ = in_stack_ffffffffffffed1c;
            b_01[0]._0_4_ = in_stack_ffffffffffffed18;
            b_01[1] = iVar38;
            b_01[2] = lVar75;
            b_01[3] = lVar37;
            _mm256_max_epi64_rpl(a_01,b_01);
            a_02[0]._4_4_ = in_stack_ffffffffffffed3c;
            a_02[0]._0_4_ = in_stack_ffffffffffffed38;
            a_02[1] = iVar35;
            a_02[2] = lVar33;
            a_02[3] = lVar34;
            b_02[0]._4_4_ = in_stack_ffffffffffffed1c;
            b_02[0]._0_4_ = in_stack_ffffffffffffed18;
            b_02[1] = iVar38;
            b_02[2] = lVar75;
            b_02[3] = lVar37;
            _mm256_max_epi64_rpl(a_02,b_02);
            a_03[0]._4_4_ = in_stack_ffffffffffffed3c;
            a_03[0]._0_4_ = in_stack_ffffffffffffed38;
            a_03[1] = iVar35;
            a_03[2] = lVar33;
            a_03[3] = lVar34;
            b_03[0]._4_4_ = in_stack_ffffffffffffed1c;
            b_03[0]._0_4_ = in_stack_ffffffffffffed18;
            b_03[1] = iVar38;
            b_03[2] = lVar75;
            b_03[3] = lVar37;
            _mm256_max_epi64_rpl(a_03,b_03);
            local_10c0._8_8_ = uStack_1198;
            local_10c0._0_8_ = local_11a0;
            local_4a0 = local_1120._0_8_;
            lStack_498 = local_1120._8_8_;
            lStack_490 = local_1120._16_8_;
            lStack_488 = local_1120._24_8_;
            local_4c0 = local_fa0;
            lStack_4b8 = lStack_f98;
            lStack_4b0 = lStack_f90;
            lStack_4a8 = lStack_f88;
            local_260 = -(ulong)(local_1120._0_8_ == local_fa0);
            lStack_258 = -(ulong)(local_1120._8_8_ == lStack_f98);
            lStack_250 = -(ulong)(local_1120._16_8_ == lStack_f90);
            lStack_248 = -(ulong)(local_1120._24_8_ == lStack_f88);
            local_460._8_8_ = lStack_258;
            local_460._0_8_ = local_260;
            local_460._16_8_ = lStack_250;
            local_460._24_8_ = lStack_248;
            auVar5 = vpcmpeqd_avx2(local_460,local_460);
            auVar20._16_8_ = uStack_1190;
            auVar20._0_16_ = local_10c0._0_16_;
            auVar20._24_8_ = uStack_1188;
            _local_10c0 = vpand_avx2(local_460 ^ auVar5,auVar20);
            local_1100._0_8_ = auVar50._0_8_;
            local_1100._8_8_ = auVar50._8_8_;
            local_1100._16_8_ = auVar50._16_8_;
            uStack_10e8 = auVar50._24_8_;
            local_1c0 = local_1100._0_8_;
            uStack_1b8 = local_1100._8_8_;
            uStack_1b0 = local_1100._16_8_;
            uStack_1a8 = uStack_10e8;
            local_1e0 = local_ec0;
            uStack_1d8 = uStack_eb8;
            uStack_1d0 = uStack_eb0;
            uStack_1c8 = uStack_ea8;
            auVar24._8_8_ = uStack_eb8;
            auVar24._0_8_ = local_ec0;
            auVar24._16_8_ = uStack_eb0;
            auVar24._24_8_ = uStack_ea8;
            auVar23._8_8_ = lStack_258;
            auVar23._0_8_ = local_260;
            auVar23._16_8_ = lStack_250;
            auVar23._24_8_ = lStack_248;
            _local_1100 = vpblendvb_avx2(auVar50,auVar24,auVar23);
            local_10e0._0_8_ = auVar51._0_8_;
            local_10e0._8_8_ = auVar51._8_8_;
            local_10e0._16_8_ = auVar51._16_8_;
            local_10e0._24_8_ = auVar51._24_8_;
            local_220 = local_10e0._0_8_;
            uStack_218 = local_10e0._8_8_;
            uStack_210 = local_10e0._16_8_;
            uStack_208 = local_10e0._24_8_;
            local_240 = local_ec0;
            uStack_238 = uStack_eb8;
            uStack_230 = uStack_eb0;
            uStack_228 = uStack_ea8;
            auVar22._8_8_ = uStack_eb8;
            auVar22._0_8_ = local_ec0;
            auVar22._16_8_ = uStack_eb0;
            auVar22._24_8_ = uStack_ea8;
            auVar21._8_8_ = lStack_258;
            auVar21._0_8_ = local_260;
            auVar21._16_8_ = lStack_250;
            auVar21._24_8_ = lStack_248;
            local_10e0 = vpblendvb_avx2(auVar51,auVar22,auVar21);
            local_480 = local_11a0;
            uStack_478 = uStack_1198;
            uStack_470 = uStack_1190;
            uStack_468 = uStack_1188;
            local_200 = local_260;
            lStack_1f8 = lStack_258;
            lStack_1f0 = lStack_250;
            lStack_1e8 = lStack_248;
            if (local_d8c < local_de8) {
              a_04[0]._4_4_ = in_stack_ffffffffffffed3c;
              a_04[0]._0_4_ = in_stack_ffffffffffffed38;
              a_04[1] = iVar35;
              a_04[2] = lVar33;
              a_04[3] = lVar34;
              b_04[0]._4_4_ = in_stack_ffffffffffffed1c;
              b_04[0]._0_4_ = in_stack_ffffffffffffed18;
              b_04[1] = iVar38;
              b_04[2] = lVar75;
              b_04[3] = lVar37;
              _mm256_min_epi64_rpl(a_04,b_04);
              a_05[0]._4_4_ = in_stack_ffffffffffffed3c;
              a_05[0]._0_4_ = in_stack_ffffffffffffed38;
              a_05[1] = iVar35;
              a_05[2] = lVar33;
              a_05[3] = lVar34;
              b_05[0]._4_4_ = in_stack_ffffffffffffed1c;
              b_05[0]._0_4_ = in_stack_ffffffffffffed18;
              b_05[1] = iVar38;
              b_05[2] = lVar75;
              b_05[3] = lVar37;
              _mm256_max_epi64_rpl(a_05,b_05);
            }
            local_dd0[local_de8 + -3] = local_10c0._0_8_;
            local_dd8[local_de8 + -3] = local_1100._0_8_;
            local_720 = local_1120._0_8_;
            lStack_718 = local_1120._8_8_;
            lStack_710 = local_1120._16_8_;
            lStack_708 = local_1120._24_8_;
            local_740 = local_fa0;
            lStack_738 = lStack_f98;
            lStack_730 = lStack_f90;
            lStack_728 = lStack_f88;
            auVar14._8_8_ = lStack_f98;
            auVar14._0_8_ = local_fa0;
            auVar14._16_8_ = lStack_f90;
            auVar14._24_8_ = lStack_f88;
            local_80 = vpcmpgtq_avx2(local_1120,auVar14);
            uStack_750 = uStack_1070;
            uStack_748 = uStack_1068;
            local_780 = local_1120._0_8_;
            lStack_778 = local_1120._8_8_;
            lStack_770 = local_1120._16_8_;
            lStack_768 = local_1120._24_8_;
            auVar13._16_8_ = uStack_1070;
            auVar13._0_16_ = auVar49._0_16_;
            auVar13._24_8_ = uStack_1068;
            local_a0 = vpcmpgtq_avx2(auVar13,local_1120);
            auVar5 = vpand_avx2(local_80,local_a0);
            local_11e0 = auVar5._0_8_;
            local_c0 = local_11e0;
            uStack_11d8 = auVar5._8_8_;
            uStack_b8 = uStack_11d8;
            uStack_11d0 = auVar5._16_8_;
            uStack_b0 = uStack_11d0;
            uStack_11c8 = auVar5._24_8_;
            uStack_a8 = uStack_11c8;
            local_1160 = auVar7._0_8_;
            local_e0 = local_1160;
            uStack_1158 = auVar7._8_8_;
            uStack_d8 = uStack_1158;
            uStack_1150 = auVar7._16_8_;
            uStack_d0 = uStack_1150;
            uStack_1148 = auVar7._24_8_;
            uStack_c8 = uStack_1148;
            auVar5 = vpand_avx2(auVar5,auVar7);
            local_4e0 = local_10c0._0_8_;
            lStack_4d8 = local_10c0._8_8_;
            lStack_4d0 = local_10c0._16_8_;
            lStack_4c8 = lStack_10a8;
            local_500 = local_1000._0_8_;
            lStack_4f8 = local_1000._8_8_;
            lStack_4f0 = local_1000._16_8_;
            lStack_4e8 = local_1000._24_8_;
            local_160 = -(ulong)(local_10c0._0_8_ == local_1000._0_8_);
            lStack_158 = -(ulong)(local_10c0._8_8_ == local_1000._8_8_);
            lStack_150 = -(ulong)(local_10c0._16_8_ == local_1000._16_8_);
            lStack_148 = -(ulong)(lStack_10a8 == local_1000._24_8_);
            local_7a0 = local_10c0._0_8_;
            lStack_798 = local_10c0._8_8_;
            lStack_790 = local_10c0._16_8_;
            lStack_788 = lStack_10a8;
            local_7c0 = local_1000._0_8_;
            lStack_7b8 = local_1000._8_8_;
            lStack_7b0 = local_1000._16_8_;
            lStack_7a8 = local_1000._24_8_;
            auVar50 = vpcmpgtq_avx2(_local_10c0,local_1000);
            local_1240 = auVar50._0_8_;
            local_100 = local_1240;
            uStack_1238 = auVar50._8_8_;
            uStack_f8 = uStack_1238;
            uStack_1230 = auVar50._16_8_;
            uStack_f0 = uStack_1230;
            uStack_1228 = auVar50._24_8_;
            uStack_e8 = uStack_1228;
            local_1200 = auVar5._0_8_;
            local_120 = local_1200;
            uStack_11f8 = auVar5._8_8_;
            uStack_118 = uStack_11f8;
            uStack_11f0 = auVar5._16_8_;
            uStack_110 = uStack_11f0;
            uStack_11e8 = auVar5._24_8_;
            uStack_108 = uStack_11e8;
            auVar50 = vpand_avx2(auVar50,auVar5);
            local_7e0 = local_1040._0_8_;
            uStack_7d8 = local_1040._8_8_;
            uStack_7d0 = local_1040._16_8_;
            uStack_7c8 = local_1040._24_8_;
            local_800 = local_1120._0_8_;
            lStack_7f8 = local_1120._8_8_;
            lStack_7f0 = local_1120._16_8_;
            lStack_7e8 = local_1120._24_8_;
            auVar8 = vpcmpgtq_avx2(local_1040,local_1120);
            local_280 = local_1000._0_8_;
            lStack_278 = local_1000._8_8_;
            lStack_270 = local_1000._16_8_;
            lStack_268 = local_1000._24_8_;
            local_2a0 = local_10c0._0_8_;
            lStack_298 = local_10c0._8_8_;
            lStack_290 = local_10c0._16_8_;
            lStack_288 = lStack_10a8;
            local_1260 = auVar50._0_8_;
            local_2c0 = local_1260;
            uStack_1258 = auVar50._8_8_;
            uStack_2b8 = uStack_1258;
            uStack_1250 = auVar50._16_8_;
            uStack_2b0 = uStack_1250;
            uStack_1248 = auVar50._24_8_;
            uStack_2a8 = uStack_1248;
            local_1000 = vpblendvb_avx2(local_1000,_local_10c0,auVar50);
            local_2e0 = local_1020._0_8_;
            uStack_2d8 = local_1020._8_8_;
            uStack_2d0 = local_1020._16_8_;
            uStack_2c8 = local_1020._24_8_;
            local_300 = local_fc0._0_8_;
            uStack_2f8 = local_fc0._8_8_;
            uStack_2f0 = local_fc0._16_8_;
            uStack_2e8 = local_fc0._24_8_;
            local_320 = local_1260;
            uStack_318 = uStack_1258;
            uStack_310 = uStack_1250;
            uStack_308 = uStack_1248;
            auVar51 = vpblendvb_avx2(local_1020,local_fc0,auVar50);
            local_340 = local_1040._0_8_;
            uStack_338 = local_1040._8_8_;
            uStack_330 = local_1040._16_8_;
            uStack_328 = local_1040._24_8_;
            local_360 = local_1120._0_8_;
            lStack_358 = local_1120._8_8_;
            lStack_350 = local_1120._16_8_;
            lStack_348 = local_1120._24_8_;
            local_380 = local_1260;
            uStack_378 = uStack_1258;
            uStack_370 = uStack_1250;
            uStack_368 = uStack_1248;
            auVar6 = vpblendvb_avx2(local_1040,local_1120,auVar50);
            local_1280 = auVar8._0_8_;
            local_140 = local_1280;
            uStack_1278 = auVar8._8_8_;
            uStack_138 = uStack_1278;
            uStack_1270 = auVar8._16_8_;
            uStack_130 = uStack_1270;
            uStack_1268 = auVar8._24_8_;
            uStack_128 = uStack_1268;
            auVar25._8_8_ = lStack_158;
            auVar25._0_8_ = local_160;
            auVar25._16_8_ = lStack_150;
            auVar25._24_8_ = lStack_148;
            auVar50 = vpand_avx2(auVar8,auVar25);
            local_1260 = auVar50._0_8_;
            local_180 = local_1260;
            uStack_1258 = auVar50._8_8_;
            uStack_178 = uStack_1258;
            uStack_1250 = auVar50._16_8_;
            uStack_170 = uStack_1250;
            uStack_1248 = auVar50._24_8_;
            uStack_168 = uStack_1248;
            local_1a0 = local_1200;
            uStack_198 = uStack_11f8;
            uStack_190 = uStack_11f0;
            uStack_188 = uStack_11e8;
            auVar5 = vpand_avx2(auVar50,auVar5);
            local_1020._0_8_ = auVar51._0_8_;
            local_3a0 = local_1020._0_8_;
            local_1020._8_8_ = auVar51._8_8_;
            uStack_398 = local_1020._8_8_;
            local_1020._16_8_ = auVar51._16_8_;
            uStack_390 = local_1020._16_8_;
            local_1020._24_8_ = auVar51._24_8_;
            uStack_388 = local_1020._24_8_;
            local_3c0 = local_fc0._0_8_;
            uStack_3b8 = local_fc0._8_8_;
            uStack_3b0 = local_fc0._16_8_;
            uStack_3a8 = local_fc0._24_8_;
            local_1260 = auVar5._0_8_;
            local_3e0 = local_1260;
            uStack_1258 = auVar5._8_8_;
            uStack_3d8 = uStack_1258;
            uStack_1250 = auVar5._16_8_;
            uStack_3d0 = uStack_1250;
            uStack_1248 = auVar5._24_8_;
            uStack_3c8 = uStack_1248;
            local_1020 = vpblendvb_avx2(auVar51,local_fc0,auVar5);
            local_1040._0_8_ = auVar6._0_8_;
            local_400 = local_1040._0_8_;
            local_1040._8_8_ = auVar6._8_8_;
            uStack_3f8 = local_1040._8_8_;
            local_1040._16_8_ = auVar6._16_8_;
            uStack_3f0 = local_1040._16_8_;
            local_1040._24_8_ = auVar6._24_8_;
            uStack_3e8 = local_1040._24_8_;
            local_420 = local_1120._0_8_;
            lStack_418 = local_1120._8_8_;
            lStack_410 = local_1120._16_8_;
            lStack_408 = local_1120._24_8_;
            local_440 = local_1260;
            uStack_438 = uStack_1258;
            uStack_430 = uStack_1250;
            uStack_428 = uStack_1248;
            local_1040 = vpblendvb_avx2(auVar6,local_1120,auVar5);
            local_560 = local_1120._0_8_;
            lStack_558 = local_1120._8_8_;
            lStack_550 = local_1120._16_8_;
            lStack_548 = local_1120._24_8_;
            local_580 = local_f60;
            uStack_578 = uStack_f58;
            uStack_570 = uStack_f50;
            uStack_568 = uStack_f48;
            auVar18._8_8_ = uStack_f58;
            auVar18._0_8_ = local_f60;
            auVar18._16_8_ = uStack_f50;
            auVar18._24_8_ = uStack_f48;
            local_1120 = vpaddq_avx2(local_1120,auVar18);
            local_de8 = local_de8 + 1;
            local_10a0 = auVar9;
            local_760 = auVar49._0_16_;
          }
          local_5a0 = local_fc0._0_8_;
          uStack_598 = local_fc0._8_8_;
          uStack_590 = local_fc0._16_8_;
          uStack_588 = local_fc0._24_8_;
          local_5c0 = local_f80;
          uStack_5b8 = uStack_f78;
          uStack_5b0 = uStack_f70;
          uStack_5a8 = uStack_f68;
          auVar50._8_8_ = uStack_f78;
          auVar50._0_8_ = local_f80;
          auVar50._16_8_ = uStack_f70;
          auVar50._24_8_ = uStack_f68;
          local_fc0 = vpaddq_avx2(local_fc0,auVar50);
        }
        local_1288 = (ulong *)local_1000;
        local_1290 = (long *)local_1020;
        local_1298 = (long *)local_1040;
        for (local_129c = 0; local_129c < local_d88; local_129c = local_129c + 1) {
          if ((long)local_e08 < (long)*local_1288) {
            local_e08 = *local_1288;
            local_dec = (int)*local_1290;
            local_df0 = (int)*local_1298;
          }
          else if (*local_1288 == local_e08) {
            if (*local_1298 < (long)local_df0) {
              local_dec = (int)*local_1290;
              local_df0 = (int)*local_1298;
            }
            else if ((*local_1298 == (long)local_df0) && (*local_1290 < (long)local_dec)) {
              local_dec = (int)*local_1290;
              local_df0 = (int)*local_1298;
            }
          }
          local_1288 = local_1288 + 1;
          local_1290 = local_1290 + 1;
          local_1298 = local_1298 + 1;
        }
        local_820 = local_e40;
        uStack_818 = uStack_e38;
        uStack_810 = uStack_e30;
        uStack_808 = uStack_e28;
        local_840 = local_e80;
        uStack_838 = uStack_e78;
        uStack_830 = uStack_e70;
        uStack_828 = uStack_e68;
        auVar12._8_8_ = uStack_e38;
        auVar12._0_8_ = local_e40;
        auVar12._16_8_ = uStack_e30;
        auVar12._24_8_ = uStack_e28;
        auVar11._8_8_ = uStack_e78;
        auVar11._0_8_ = local_e80;
        auVar11._16_8_ = uStack_e70;
        auVar11._24_8_ = uStack_e68;
        local_ce0 = vpcmpgtq_avx2(auVar12,auVar11);
        local_860 = local_ea0;
        uStack_858 = uStack_e98;
        uStack_850 = uStack_e90;
        uStack_848 = uStack_e88;
        local_880 = local_e60;
        uStack_878 = uStack_e58;
        uStack_870 = uStack_e50;
        uStack_868 = uStack_e48;
        auVar10._8_8_ = uStack_e98;
        auVar10._0_8_ = local_ea0;
        auVar10._16_8_ = uStack_e90;
        auVar10._24_8_ = uStack_e88;
        auVar9._8_8_ = uStack_e58;
        auVar9._0_8_ = local_e60;
        auVar9._16_8_ = uStack_e50;
        auVar9._24_8_ = uStack_e48;
        local_d00 = vpcmpgtq_avx2(auVar10,auVar9);
        local_60 = vpor_avx2(local_ce0,local_d00);
        if ((((((((((((((((((((((((((((((((local_60 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_60 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_60 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_60 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_60 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_60 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_60 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_60 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_60 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_60 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_60 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_60 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_60 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_60 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_60 >> 0x7f,0) != '\0') ||
                          (local_60 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_60 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_60 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_60 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_60 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_60 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_60 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_60 >> 0xbf,0) != '\0') ||
                  (local_60 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_60 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_60 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_60 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_60 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_60 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_60 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_60[0x1f] < '\0') {
          local_de0->flag = local_de0->flag | 0x40;
          local_e08 = 0;
          local_dec = 0;
          local_df0 = 0;
        }
        local_de0->score = (int)local_e08;
        local_de0->end_query = local_dec;
        local_de0->end_ref = local_df0;
        parasail_free(local_dc0);
        parasail_free(local_db8);
        parasail_free(local_db0);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_da8);
        }
        local_d60 = local_de0;
      }
    }
  }
  return local_d60;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vNH, vOpen),
                    _mm256_sub_epi64(vF, vGap));
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vWH, vOpen),
                    _mm256_sub_epi64(vE, vGap));
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}